

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

void Mvc_CoverMakeCubeFree(Mvc_Cover_t *pCover)

{
  uint local_1c;
  Mvc_Cube_t *pMStack_18;
  int _i_;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  for (pMStack_18 = (pCover->lCubes).pHead; pMStack_18 != (Mvc_Cube_t *)0x0;
      pMStack_18 = pMStack_18->pNext) {
    if ((*(uint *)&pMStack_18->field_0x8 & 0xffffff) == 0) {
      pMStack_18->pData[0] = pMStack_18->pData[0] & (pCover->pMask->pData[0] ^ 0xffffffff);
    }
    else if ((*(uint *)&pMStack_18->field_0x8 & 0xffffff) == 1) {
      pMStack_18->pData[0] = pMStack_18->pData[0] & (pCover->pMask->pData[0] ^ 0xffffffff);
      *(uint *)&pMStack_18->field_0x14 =
           *(uint *)&pMStack_18->field_0x14 & (*(uint *)&pCover->pMask->field_0x14 ^ 0xffffffff);
    }
    else {
      for (local_1c = *(uint *)&pMStack_18->field_0x8 & 0xffffff; -1 < (int)local_1c;
          local_1c = local_1c - 1) {
        pMStack_18->pData[(int)local_1c] =
             pMStack_18->pData[(int)local_1c] & (pCover->pMask->pData[(int)local_1c] ^ 0xffffffff);
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverMakeCubeFree( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // remove this cube from the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitSharp( pCube, pCube, pCover->pMask );
}